

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O1

bool __thiscall
cmTargetCompileOptionsCommand::HandleDirectContent
          (cmTargetCompileOptionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  cmListFileBacktrace lfbt;
  cmValueWithOrigin entry;
  string local_b8;
  cmListFileBacktrace local_98;
  cmValueWithOrigin local_68;
  
  cmMakefile::GetBacktrace(&local_98,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x11])
            (&local_b8,this,content);
  cmValueWithOrigin::cmValueWithOrigin(&local_68,&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmTarget::InsertCompileOption(tgt,&local_68,false);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_68.Backtrace.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Value._M_dataplus._M_p != &local_68.Value.field_2) {
    operator_delete(local_68.Value._M_dataplus._M_p,local_68.Value.field_2._M_allocated_capacity + 1
                   );
  }
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_98.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return true;
}

Assistant:

bool cmTargetCompileOptionsCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                                   bool, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmValueWithOrigin entry(this->Join(content), lfbt);
  tgt->InsertCompileOption(entry);
  return true;
}